

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O3

bool __thiscall glslang::HlslGrammar::acceptPostQualifier(HlslGrammar *this,TQualifier *qualifier)

{
  EHlslTokenClass EVar1;
  
  while( true ) {
    EVar1 = HlslTokenStream::peek(&this->super_HlslTokenStream);
    if (EVar1 != EHTokConst) break;
    *(ulong *)&qualifier->field_0x8 = *(ulong *)&qualifier->field_0x8 & 0xffffffffffffff80 | 2;
    HlslTokenStream::advanceToken(&this->super_HlslTokenStream);
  }
  return true;
}

Assistant:

bool HlslGrammar::acceptPostQualifier(TQualifier& qualifier)
{
    do {
        switch (peek()) {
        case EHTokConst:
            qualifier.storage = EvqConst;
            break;
        default:
            return true;
        }
        advanceToken();
    } while (true);
}